

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_parameter.hpp
# Opt level: O3

void __thiscall
ruckig::InputParameter<3UL,_ruckig::StandardVector>::~InputParameter
          (InputParameter<3UL,_ruckig::StandardVector> *this)

{
  void *pvVar1;
  pointer paVar2;
  
  if ((this->per_section_minimum_duration).
      super__Optional_base<std::vector<double,_std::allocator<double>_>,_false,_false>._M_payload.
      super__Optional_payload<std::vector<double,_std::allocator<double>_>,_true,_false,_false>.
      super__Optional_payload_base<std::vector<double,_std::allocator<double>_>_>._M_engaged == true
     ) {
    (this->per_section_minimum_duration).
    super__Optional_base<std::vector<double,_std::allocator<double>_>,_false,_false>._M_payload.
    super__Optional_payload<std::vector<double,_std::allocator<double>_>,_true,_false,_false>.
    super__Optional_payload_base<std::vector<double,_std::allocator<double>_>_>._M_engaged = false;
    pvVar1 = *(void **)&(this->per_section_minimum_duration).
                        super__Optional_base<std::vector<double,_std::allocator<double>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::vector<double,_std::allocator<double>_>,_true,_false,_false>
                        .super__Optional_payload_base<std::vector<double,_std::allocator<double>_>_>
                        ._M_payload._M_value.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl;
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,(long)*(pointer *)
                                    ((long)&(this->per_section_minimum_duration).
                                            super__Optional_base<std::vector<double,_std::allocator<double>_>,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<std::vector<double,_std::allocator<double>_>,_true,_false,_false>
                                            .
                                            super__Optional_payload_base<std::vector<double,_std::allocator<double>_>_>
                                            ._M_payload._M_value.
                                            super__Vector_base<double,_std::allocator<double>_> +
                                    0x10) - (long)pvVar1);
    }
  }
  if ((this->per_section_min_position).
      super__Optional_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
      ._M_engaged == true) {
    (this->per_section_min_position).
    super__Optional_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
    ._M_engaged = false;
    pvVar1 = *(void **)&(this->per_section_min_position).
                        super__Optional_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                        ._M_payload._M_value.
                        super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                        ._M_impl;
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,(long)*(pointer *)
                                    ((long)&(this->per_section_min_position).
                                            super__Optional_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_true,_false,_false>
                                            .
                                            super__Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                                            ._M_payload._M_value.
                                            super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                                    + 0x10) - (long)pvVar1);
    }
  }
  if ((this->per_section_max_position).
      super__Optional_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
      ._M_engaged == true) {
    (this->per_section_max_position).
    super__Optional_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
    ._M_engaged = false;
    pvVar1 = *(void **)&(this->per_section_max_position).
                        super__Optional_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                        ._M_payload._M_value.
                        super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                        ._M_impl;
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,(long)*(pointer *)
                                    ((long)&(this->per_section_max_position).
                                            super__Optional_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_true,_false,_false>
                                            .
                                            super__Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                                            ._M_payload._M_value.
                                            super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                                    + 0x10) - (long)pvVar1);
    }
  }
  if ((this->per_section_min_acceleration).
      super__Optional_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
      ._M_engaged == true) {
    (this->per_section_min_acceleration).
    super__Optional_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
    ._M_engaged = false;
    pvVar1 = *(void **)&(this->per_section_min_acceleration).
                        super__Optional_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                        ._M_payload._M_value.
                        super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                        ._M_impl;
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,(long)*(pointer *)
                                    ((long)&(this->per_section_min_acceleration).
                                            super__Optional_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_true,_false,_false>
                                            .
                                            super__Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                                            ._M_payload._M_value.
                                            super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                                    + 0x10) - (long)pvVar1);
    }
  }
  if ((this->per_section_min_velocity).
      super__Optional_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
      ._M_engaged == true) {
    (this->per_section_min_velocity).
    super__Optional_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
    ._M_engaged = false;
    pvVar1 = *(void **)&(this->per_section_min_velocity).
                        super__Optional_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                        ._M_payload._M_value.
                        super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                        ._M_impl;
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,(long)*(pointer *)
                                    ((long)&(this->per_section_min_velocity).
                                            super__Optional_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_true,_false,_false>
                                            .
                                            super__Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                                            ._M_payload._M_value.
                                            super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                                    + 0x10) - (long)pvVar1);
    }
  }
  if ((this->per_section_max_jerk).
      super__Optional_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
      ._M_engaged == true) {
    (this->per_section_max_jerk).
    super__Optional_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
    ._M_engaged = false;
    pvVar1 = *(void **)&(this->per_section_max_jerk).
                        super__Optional_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                        ._M_payload._M_value.
                        super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                        ._M_impl;
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,(long)*(pointer *)
                                    ((long)&(this->per_section_max_jerk).
                                            super__Optional_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_true,_false,_false>
                                            .
                                            super__Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                                            ._M_payload._M_value.
                                            super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                                    + 0x10) - (long)pvVar1);
    }
  }
  if ((this->per_section_max_acceleration).
      super__Optional_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
      ._M_engaged == true) {
    (this->per_section_max_acceleration).
    super__Optional_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
    ._M_engaged = false;
    pvVar1 = *(void **)&(this->per_section_max_acceleration).
                        super__Optional_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                        ._M_payload._M_value.
                        super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                        ._M_impl;
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,(long)*(pointer *)
                                    ((long)&(this->per_section_max_acceleration).
                                            super__Optional_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_true,_false,_false>
                                            .
                                            super__Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                                            ._M_payload._M_value.
                                            super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                                    + 0x10) - (long)pvVar1);
    }
  }
  if ((this->per_section_max_velocity).
      super__Optional_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
      ._M_engaged == true) {
    (this->per_section_max_velocity).
    super__Optional_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
    ._M_engaged = false;
    pvVar1 = *(void **)&(this->per_section_max_velocity).
                        super__Optional_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                        ._M_payload._M_value.
                        super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                        ._M_impl;
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,(long)*(pointer *)
                                    ((long)&(this->per_section_max_velocity).
                                            super__Optional_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_false,_false>
                                            ._M_payload.
                                            super__Optional_payload<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_true,_false,_false>
                                            .
                                            super__Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
                                            ._M_payload._M_value.
                                            super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                                    + 0x10) - (long)pvVar1);
    }
  }
  paVar2 = (this->intermediate_positions).
           super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (paVar2 != (pointer)0x0) {
    operator_delete(paVar2,(long)(this->intermediate_positions).
                                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)paVar2);
    return;
  }
  return;
}

Assistant:

inline static double v_at_a_zero(double v0, double a0, double j) {
        return v0 + (a0 * a0) / (2 * j);
    }